

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSAtom JS_NewAtomStr(JSContext *ctx,JSString *p)

{
  BOOL BVar1;
  JSAtom JVar2;
  JSString *in_RDI;
  uint32_t n;
  JSRuntime *rt;
  undefined4 in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  JSRuntime *rt_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  rt_00 = *(JSRuntime **)&in_RDI[1].field_0x8;
  BVar1 = is_num_string((uint32_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        in_RDI);
  if ((BVar1 == 0) || (0x7fffffff < in_stack_ffffffffffffffdc)) {
    JVar2 = __JS_NewAtom((JSRuntime *)ctx,p,rt._4_4_);
  }
  else {
    js_free_string(rt_00,(JSString *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    JVar2 = __JS_AtomFromUInt32(in_stack_ffffffffffffffdc);
  }
  return JVar2;
}

Assistant:

static JSAtom JS_NewAtomStr(JSContext *ctx, JSString *p)
{
    JSRuntime *rt = ctx->rt;
    uint32_t n;
    if (is_num_string(&n, p)) {
        if (n <= JS_ATOM_MAX_INT) {
            js_free_string(rt, p);
            return __JS_AtomFromUInt32(n);
        }
    }
    /* XXX: should generate an exception */
    return __JS_NewAtom(rt, p, JS_ATOM_TYPE_STRING);
}